

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

MemoryCopy * __thiscall MixedArena::alloc<wasm::MemoryCopy>(MixedArena *this)

{
  MemoryCopy *pMVar1;
  
  pMVar1 = (MemoryCopy *)allocSpace(this,0x48,8);
  *(undefined8 *)&(pMVar1->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression = 0;
  (pMVar1->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id = 0;
  pMVar1->dest = (Expression *)0x0;
  pMVar1->source = (Expression *)0x0;
  pMVar1->size = (Expression *)0x0;
  (pMVar1->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression._id = MemoryCopyId;
  (pMVar1->destMemory).super_IString.str._M_len = 0;
  (pMVar1->destMemory).super_IString.str._M_str = (char *)0x0;
  (pMVar1->sourceMemory).super_IString.str._M_len = 0;
  (pMVar1->sourceMemory).super_IString.str._M_str = (char *)0x0;
  return pMVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }